

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

char * lws_get_mimetype(char *file,lws_http_mount *m)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  lws_protocol_vhost_options *local_58;
  lws_mimetype *mt;
  char *fallback_mimetype;
  size_t i;
  size_t len;
  size_t n;
  lws_protocol_vhost_options *pvo;
  lws_http_mount *m_local;
  char *file_local;
  
  sVar2 = strlen(file);
  mt = (lws_mimetype *)0x0;
  if (m == (lws_http_mount *)0x0) {
    local_58 = (lws_protocol_vhost_options *)0x0;
  }
  else {
    local_58 = m->extra_mimetypes;
  }
  n = (size_t)local_58;
  do {
    if (n == 0) {
      fallback_mimetype = (char *)0x0;
      while( true ) {
        if ((char *)0x12 < fallback_mimetype) {
          if (mt == (lws_mimetype *)0x0) {
            file_local = (char *)0x0;
          }
          else {
            _lws_log(8,"%s: match to any mimetype: %s\n","lws_get_mimetype",mt);
            file_local = (char *)mt;
          }
          return file_local;
        }
        sVar3 = strlen(server_mimetypes[(long)fallback_mimetype].extension);
        if ((sVar3 < sVar2) &&
           (iVar1 = strcasecmp(file + (sVar2 - sVar3),
                               server_mimetypes[(long)fallback_mimetype].extension), iVar1 == 0))
        break;
        fallback_mimetype = fallback_mimetype + 1;
      }
      _lws_log(8,"%s: match to server mimetype: %s\n","lws_get_mimetype",
               server_mimetypes[(long)fallback_mimetype].mimetype);
      return server_mimetypes[(long)fallback_mimetype].mimetype;
    }
    if ((mt == (lws_mimetype *)0x0) && (**(char **)(n + 0x10) == '*')) {
      mt = *(lws_mimetype **)(n + 0x18);
    }
    else {
      sVar3 = strlen(*(char **)(n + 0x10));
      if ((sVar3 < sVar2) &&
         (iVar1 = strcasecmp(file + (sVar2 - sVar3),*(char **)(n + 0x10)), iVar1 == 0)) {
        _lws_log(8,"%s: match to user mimetype: %s\n","lws_get_mimetype",*(undefined8 *)(n + 0x18));
        return *(char **)(n + 0x18);
      }
    }
    n = *(size_t *)n;
  } while( true );
}

Assistant:

const char *
lws_get_mimetype(const char *file, const struct lws_http_mount *m)
{
	const struct lws_protocol_vhost_options *pvo;
	size_t n = strlen(file), len, i;
	const char *fallback_mimetype = NULL;
	const struct lws_mimetype *mt;

	/* prioritize user-defined mimetypes */
	for (pvo = m ? m->extra_mimetypes : NULL; pvo; pvo = pvo->next) {
		/* ie, match anything */
		if (!fallback_mimetype && pvo->name[0] == '*') {
			fallback_mimetype = pvo->value;
			continue;
		}

		len = strlen(pvo->name);
		if (n > len && !strcasecmp(&file[n - len], pvo->name)) {
			lwsl_info("%s: match to user mimetype: %s\n", __func__,
				  pvo->value);
			return pvo->value;
		}
	}

	/* fallback to server-defined mimetypes */
	for (i = 0; i < LWS_ARRAY_SIZE(server_mimetypes); ++i) {
		mt = &server_mimetypes[i];

		len = strlen(mt->extension);
		if (n > len && !strcasecmp(&file[n - len], mt->extension)) {
			lwsl_info("%s: match to server mimetype: %s\n", __func__,
				  mt->mimetype);
			return mt->mimetype;
		}
	}

	/* fallback to '*' if defined */
	if (fallback_mimetype) {
		lwsl_info("%s: match to any mimetype: %s\n", __func__,
			  fallback_mimetype);
		return fallback_mimetype;
	}

	return NULL;
}